

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive.cpp
# Opt level: O3

void __thiscall Archive::Archive(Archive *this,Buffer *b,bool *error)

{
  long *plVar1;
  long *plVar2;
  int iVar3;
  uint8_t *puVar4;
  string local_88;
  undefined1 auStack_68 [8];
  string name;
  child_iterator it;
  
  this->data = b;
  (this->symbolTable).data = (uint8_t *)0x0;
  (this->symbolTable).len = 0;
  (this->stringTable).data = (uint8_t *)0x0;
  (this->stringTable).len = 0;
  this->firstRegularData = (uint8_t *)0x0;
  *error = false;
  plVar1 = (long *)(b->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_start;
  plVar2 = (long *)(b->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
  if (((ulong)((long)plVar2 - (long)plVar1) < 8) || (*plVar1 != 0xa3e686372613c21)) {
LAB_00c256aa:
    *error = true;
    return;
  }
  if (plVar2 == plVar1) {
    name.field_2._8_8_ = 0;
    it.child.parent._0_6_ = 0;
    it.child.parent._6_2_ = 0;
    it.child.data._0_4_ = 0;
    it.child.data._4_2_ = 0;
    it.child.len._0_1_ = 0;
  }
  else {
    name.field_2._8_8_ = 0;
    it.child.parent._0_6_ = 0;
    it.child.parent._6_2_ = 0;
    it.child.data._0_4_ = 0;
    it.child.data._4_2_ = 0;
    it.child.len._0_1_ = 0;
    Child::Child((Child *)auStack_68,this,(uint8_t *)(plVar1 + 1),(bool *)&it.child.len);
    it.child.data._0_4_ = (int)(undefined6)name._M_string_length;
    it.child.data._4_2_ = (ushort)((uint6)(undefined6)name._M_string_length >> 0x20);
    name.field_2._8_8_ = auStack_68;
    it.child.parent._0_6_ = name._M_dataplus._M_p._0_6_;
    it.child.parent._6_2_ = name._M_dataplus._M_p._6_2_;
    if (((byte)it.child.len & 1) != 0) goto LAB_00c256aa;
  }
  if ((ArchiveMemberHeader *)CONCAT26(it.child.parent._6_2_,it.child.parent._0_6_) ==
      (ArchiveMemberHeader *)0x0) {
    return;
  }
  ArchiveMemberHeader::getName_abi_cxx11_
            ((string *)auStack_68,
             (ArchiveMemberHeader *)CONCAT26(it.child.parent._6_2_,it.child.parent._0_6_));
  iVar3 = std::__cxx11::string::compare((char *)auStack_68);
  if (iVar3 == 0) {
    (this->symbolTable).data =
         (uint8_t *)
         (CONCAT26(it.child.parent._6_2_,it.child.parent._0_6_) + (ulong)it.child.data._4_2_);
    (this->symbolTable).len = (int)it.child.data - (uint)it.child.data._4_2_;
    child_iterator::operator++((child_iterator *)((long)&name.field_2 + 8));
    *error = (bool)(byte)it.child.len;
    if (((bool)(byte)it.child.len != false) ||
       ((ArchiveMemberHeader *)CONCAT26(it.child.parent._6_2_,it.child.parent._0_6_) ==
        (ArchiveMemberHeader *)0x0)) goto LAB_00c25823;
    ArchiveMemberHeader::getName_abi_cxx11_
              (&local_88,
               (ArchiveMemberHeader *)CONCAT26(it.child.parent._6_2_,it.child.parent._0_6_));
    std::__cxx11::string::operator=((string *)auStack_68,(string *)&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
  }
  iVar3 = std::__cxx11::string::compare(auStack_68);
  if (iVar3 == 0) {
    (this->stringTable).data =
         (uint8_t *)
         (CONCAT26(it.child.parent._6_2_,it.child.parent._0_6_) + (ulong)it.child.data._4_2_);
    (this->stringTable).len = (int)it.child.data - (uint)it.child.data._4_2_;
    child_iterator::operator++((child_iterator *)((long)&name.field_2 + 8));
    *error = (bool)(byte)it.child.len;
    if (((bool)(byte)it.child.len != false) ||
       (puVar4 = (uint8_t *)CONCAT26(it.child.parent._6_2_,it.child.parent._0_6_),
       puVar4 == (uint8_t *)0x0)) goto LAB_00c25823;
  }
  else {
    if (*(char *)auStack_68 == '/') {
      *error = true;
      goto LAB_00c25823;
    }
    puVar4 = (uint8_t *)CONCAT26(it.child.parent._6_2_,it.child.parent._0_6_);
  }
  this->firstRegularData = puVar4;
LAB_00c25823:
  if (auStack_68 != (undefined1  [8])&name._M_string_length) {
    operator_delete((void *)auStack_68,
                    CONCAT26(name._M_string_length._6_2_,(undefined6)name._M_string_length) + 1);
  }
  return;
}

Assistant:

Archive::Archive(Buffer& b, bool& error)
  : data(b), symbolTable({nullptr, 0}), stringTable({nullptr, 0}),
    firstRegularData(nullptr) {
  error = false;
  if (data.size() < strlen(magic) ||
      memcmp(data.data(), magic, strlen(magic))) {
    error = true;
    return;
  }

  // We require GNU format archives. So the first member may be named "/" and it
  // points to the symbol table.  The next member may optionally be "//" and
  // point to a string table if a filename is too large to fit in the 16-char
  // name field of the header.
  child_iterator it = child_begin(false);
  if (it.hasError()) {
    error = true;
    return;
  }
  child_iterator end = child_end();
  if (it == end) {
    return; // Empty archive.
  }

  const Child* c = &*it;

  auto increment = [&]() {
    ++it;
    error = it.hasError();
    if (error) {
      return true;
    }
    c = &*it;
    return false;
  };

  std::string name = c->getRawName();
  if (name == "/") {
    symbolTable = c->getBuffer();
    if (increment() || it == end) {
      return;
    }
    name = c->getRawName();
  }

  if (name == "//") {
    stringTable = c->getBuffer();
    if (increment() || it == end) {
      return;
    }
    setFirstRegular(*c);
    return;
  }
  if (name[0] != '/') {
    setFirstRegular(*c);
    return;
  }
  // Not a GNU archive.
  error = true;
}